

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.hpp
# Opt level: O0

void diy::kdtree_sampling<Block,diy::Point<float,2u>>
               (Master *master,Assigner *assigner,int dim,ContinuousBounds *domain,
               offset_in_Block_to_vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>
               points,size_t samples,bool wrap)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int _proc;
  runtime_error *this;
  undefined4 extraout_var;
  communicator *this_00;
  reference piVar4;
  int in_EDX;
  char *__to;
  char *__to_00;
  Assigner *in_RSI;
  Master *in_RDI;
  offset_in_Block_to_vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> in_R8;
  size_t in_R9;
  byte in_stack_00000008;
  int i_1;
  int expected;
  KDTreePartners partners;
  KDTreeSamplingPartition<Block,_diy::Point<float,_2U>_> kdtree_partition;
  Direction wrap_dir;
  Direction dir;
  int j;
  BlockID self;
  RCLink *link;
  int i;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int>
  *vargs;
  undefined4 in_stack_fffffffffffff888;
  int in_stack_fffffffffffff88c;
  int in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff894;
  undefined4 in_stack_fffffffffffff898;
  Master *master_00;
  Direction *in_stack_fffffffffffff8a8;
  RegularLink<diy::Bounds<float>_> *in_stack_fffffffffffff8b0;
  RegularLink<diy::Bounds<float>_> *in_stack_fffffffffffff8b8;
  Bounds *in_stack_fffffffffffff8c0;
  reference in_stack_fffffffffffff8c8;
  RegularLink<diy::Bounds<float>_> *in_stack_fffffffffffff8d0;
  RegularLink<diy::Bounds<float>_> *in_stack_fffffffffffff8d8;
  Direction *in_stack_fffffffffffff8e0;
  Link *in_stack_fffffffffffff920;
  uint local_6c8;
  int local_6c4;
  undefined1 local_6c0 [392];
  Bounds *in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffad7;
  int in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  KDTreePartners *in_stack_fffffffffffffae0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  in_stack_fffffffffffffb48;
  string_view in_stack_fffffffffffffb58;
  int local_2bc;
  BlockID local_2b8 [56];
  RegularLink<diy::Bounds<float>_> *local_f8;
  uint local_ec;
  undefined1 local_e5;
  int local_d4;
  string local_d0 [39];
  byte local_a9;
  size_t local_a8;
  offset_in_Block_to_vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> local_a0
  ;
  int local_8c;
  Assigner *local_88;
  Master *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_78;
  basic_string_view<char> local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  int *local_40;
  char *local_38;
  string *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_10;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_8;
  
  local_a9 = in_stack_00000008 & 1;
  local_a8 = in_R9;
  local_a0 = in_R8;
  local_8c = in_EDX;
  local_88 = in_RSI;
  local_80 = in_RDI;
  uVar1 = Assigner::nblocks(in_RSI);
  iVar2 = Assigner::nblocks(local_88);
  if ((uVar1 & iVar2 - 1U) == 0) {
    for (local_ec = 0; uVar1 = local_ec, uVar3 = Master::size((Master *)0x195d05),
        (int)uVar1 < (int)uVar3; local_ec = local_ec + 1) {
      iVar2 = Master::link(local_80,(char *)(ulong)local_ec,__to);
      local_f8 = (RegularLink<diy::Bounds<float>_> *)CONCAT44(extraout_var,iVar2);
      RegularLink<diy::Bounds<float>_>::RegularLink
                (in_stack_fffffffffffff8d0,(int)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
                 in_stack_fffffffffffff8c0,(Bounds *)in_stack_fffffffffffff8b8);
      RegularLink<diy::Bounds<float>_>::operator=
                ((RegularLink<diy::Bounds<float>_> *)
                 CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                 (RegularLink<diy::Bounds<float>_> *)
                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
      RegularLink<diy::Bounds<float>_>::~RegularLink
                ((RegularLink<diy::Bounds<float>_> *)
                 CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
      if ((local_a9 & 1) != 0) {
        iVar2 = Master::gid((Master *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                            in_stack_fffffffffffff88c);
        this_00 = Master::communicator(local_80);
        _proc = mpi::communicator::rank(this_00);
        BlockID::BlockID(local_2b8,iVar2,_proc);
        for (local_2bc = 0; local_2bc < local_8c; local_2bc = local_2bc + 1) {
          Direction::Direction
                    (in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                     (int)in_stack_fffffffffffff8d8);
          Direction::Direction
                    (in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                     (int)in_stack_fffffffffffff8d8);
          piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                             ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                              CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                              CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          *piVar4 = -1;
          in_stack_fffffffffffff8e0 =
               (Direction *)
               itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                         ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                          CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          *(int *)&(in_stack_fffffffffffff8e0->super_DynamicPoint<int,_4UL>).
                   super_small_vector<int,_4UL,_0UL,_std::allocator<int>_> = -1;
          Link::add_neighbor((Link *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                             (BlockID *)
                             CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          RegularLink<diy::Bounds<float>_>::add_bounds
                    ((RegularLink<diy::Bounds<float>_> *)
                     CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (Bounds *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          in_stack_fffffffffffff8d8 = local_f8;
          Direction::Direction
                    ((Direction *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (Direction *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          RegularLink<diy::Bounds<float>_>::add_direction
                    (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
          Direction::~Direction((Direction *)0x195ed6);
          in_stack_fffffffffffff8d0 = local_f8;
          Direction::Direction
                    ((Direction *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (Direction *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          RegularLink<diy::Bounds<float>_>::add_wrap
                    ((RegularLink<diy::Bounds<float>_> *)
                     CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (Direction *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          Direction::~Direction((Direction *)0x195f1b);
          in_stack_fffffffffffff8c8 =
               itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                         ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                          CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          *in_stack_fffffffffffff8c8 = 1;
          in_stack_fffffffffffff8c0 =
               (Bounds *)
               itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                         ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                          CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          *(int *)&(in_stack_fffffffffffff8c0->min).
                   super_small_vector<float,_4UL,_0UL,_std::allocator<float>_> = 1;
          Link::add_neighbor((Link *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                             (BlockID *)
                             CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          RegularLink<diy::Bounds<float>_>::add_bounds
                    ((RegularLink<diy::Bounds<float>_> *)
                     CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (Bounds *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          in_stack_fffffffffffff8b8 = local_f8;
          Direction::Direction
                    ((Direction *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (Direction *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          RegularLink<diy::Bounds<float>_>::add_direction
                    (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
          Direction::~Direction((Direction *)0x195fdc);
          in_stack_fffffffffffff8b0 = local_f8;
          Direction::Direction
                    ((Direction *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (Direction *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          RegularLink<diy::Bounds<float>_>::add_wrap
                    ((RegularLink<diy::Bounds<float>_> *)
                     CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (Direction *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          Direction::~Direction((Direction *)0x196021);
          Direction::~Direction((Direction *)0x19602e);
          Direction::~Direction((Direction *)0x19603b);
        }
      }
    }
    detail::KDTreeSamplingPartition<Block,_diy::Point<float,_2U>_>::KDTreeSamplingPartition
              ((KDTreeSamplingPartition<Block,_diy::Point<float,_2U>_> *)&stack0xfffffffffffffba8,
               local_8c,local_a0,local_a8);
    Assigner::nblocks(local_88);
    master_00 = (Master *)local_6c0;
    detail::KDTreePartners::KDTreePartners
              (in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,in_stack_fffffffffffffad8,
               (bool)in_stack_fffffffffffffad7,in_stack_fffffffffffffac8);
    reduce<diy::detail::KDTreeSamplingPartition<Block,diy::Point<float,2u>>,diy::detail::KDTreePartners>
              (master_00,(Assigner *)CONCAT44(local_8c,in_stack_fffffffffffff898),
               (KDTreePartners *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
               (KDTreeSamplingPartition<Block,_diy::Point<float,_2U>_> *)
               CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    local_6c4 = 0;
    local_6c8 = 0;
    while (uVar1 = local_6c8, uVar3 = Master::size((Master *)0x196227), (int)uVar1 < (int)uVar3) {
      Master::link(local_80,(char *)(ulong)local_6c8,__to_00);
      in_stack_fffffffffffff890 = Link::size_unique(in_stack_fffffffffffff920);
      local_6c4 = in_stack_fffffffffffff890 + local_6c4;
      local_6c8 = local_6c8 + 1;
    }
    Master::set_expected(local_80,local_6c4);
    detail::KDTreePartners::~KDTreePartners
              ((KDTreePartners *)CONCAT44(uVar1,in_stack_fffffffffffff890));
    return;
  }
  local_e5 = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_d4 = Assigner::nblocks(local_88);
  local_30 = local_d0;
  local_38 = "KD-tree requires a number of blocks that\'s a power of 2, got {}";
  local_40 = &local_d4;
  local_58.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<int,char[64],char>
                 ((char (*) [64])CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                  (remove_reference_t<int> *)0x195b30);
  local_48 = &local_58;
  local_68 = fmt::v7::to_string_view<char,_0>((char *)0x195b7f);
  local_20 = &local_78;
  local_28 = local_48;
  local_18 = local_48;
  local_8 = local_48;
  local_10 = local_20;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_20,1,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_48->string);
  fmt::v7::detail::vformat_abi_cxx11_
            (in_stack_fffffffffffffb58,(format_args)in_stack_fffffffffffffb48);
  std::runtime_error::runtime_error(this,local_d0);
  local_e5 = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void kdtree_sampling
               (Master&                         master,      //!< master object
                const Assigner&                 assigner,    //!< assigner object
                int                             dim,         //!< dimensionality
                const ContinuousBounds&         domain,      //!< global data extents
                std::vector<Point>  Block::*    points,      //!< input points to sort into kd-tree
                size_t                          samples,     //!< number of samples to take in each block
                bool                            wrap = false)//!< periodic boundaries in all dimensions
    {
        if (assigner.nblocks() & (assigner.nblocks() - 1))
            throw std::runtime_error(fmt::format("KD-tree requires a number of blocks that's a power of 2, got {}", assigner.nblocks()));

        typedef     diy::RegularContinuousLink      RCLink;

        for (int i = 0; i < static_cast<int>(master.size()); ++i)
        {
            RCLink* link   = static_cast<RCLink*>(master.link(i));
            *link = RCLink(dim, domain, domain);

            if (wrap)       // set up the links to self
            {
                diy::BlockID self = { master.gid(i), master.communicator().rank() };
                for (int j = 0; j < dim; ++j)
                {
                    diy::Direction dir(dim,0), wrap_dir(dim,0);

                    // left
                    dir[j] = -1; wrap_dir[j] = -1;
                    link->add_neighbor(self);
                    link->add_bounds(domain);
                    link->add_direction(dir);
                    link->add_wrap(wrap_dir);

                    // right
                    dir[j] = 1; wrap_dir[j] = 1;
                    link->add_neighbor(self);
                    link->add_bounds(domain);
                    link->add_direction(dir);
                    link->add_wrap(wrap_dir);
                }
            }
        }

        detail::KDTreeSamplingPartition<Block,Point>    kdtree_partition(dim, points, samples);

        detail::KDTreePartners                          partners(dim, assigner.nblocks(), wrap, domain);
        reduce(master, assigner, partners, kdtree_partition);

        // update master.expected to match the links
        int expected = 0;
        for (int i = 0; i < static_cast<int>(master.size()); ++i)
            expected += master.link(i)->size_unique();
        master.set_expected(expected);
    }